

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O1

void __thiscall
duckdb::RowGroupCollection::Initialize(RowGroupCollection *this,PersistentTableData *data)

{
  RowGroupSegmentTree *pRVar1;
  SegmentLock l;
  unique_lock<std::mutex> local_30;
  
  pRVar1 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(&this->row_groups);
  local_30._M_device = &(pRVar1->super_SegmentTree<duckdb::RowGroup,_true>).node_lock;
  local_30._M_owns = false;
  ::std::unique_lock<std::mutex>::lock(&local_30);
  local_30._M_owns = true;
  LOCK();
  (this->total_rows).super___atomic_base<unsigned_long>._M_i = data->total_rows;
  UNLOCK();
  pRVar1 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(&this->row_groups);
  RowGroupSegmentTree::Initialize(pRVar1,data);
  TableStatistics::Initialize(&this->stats,&this->types,data);
  ::std::unique_lock<std::mutex>::~unique_lock(&local_30);
  return;
}

Assistant:

void RowGroupCollection::Initialize(PersistentTableData &data) {
	D_ASSERT(this->row_start == 0);
	auto l = row_groups->Lock();
	this->total_rows = data.total_rows;
	row_groups->Initialize(data);
	stats.Initialize(types, data);
}